

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O1

void __thiscall TApp_IniNotRequired_Test::TestBody(TApp_IniNotRequired_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  int three;
  int two;
  int one;
  TempFile tmpini;
  ofstream out;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  AssertHelper local_3a8;
  int local_39c [3];
  TempFile local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  undefined1 *local_230;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 local_1f0 [184];
  ios_base local_138 [264];
  
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"TestIniTmp.ini","");
  TempFile::TempFile(&local_390,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"--config","");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_390._name._M_dataplus._M_p,
             local_390._name._M_dataplus._M_p + local_390._name._M_string_length);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Read an ini file","");
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_270,&local_290,&local_2b0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  std::ofstream::ofstream(&local_230,(string *)&local_390,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"[default]",9);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"two=99",6);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"three=3",7);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  local_39c[2] = 0;
  local_39c[1] = 0;
  local_39c[0] = 0;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"--one","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_2d0,local_39c + 2,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"--two","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_310,local_39c + 1,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"--three","");
  pcVar3 = "";
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"","");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_350,local_39c,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--one=1","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_230,
             (string *)local_210);
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  TApp::run(&this->super_TApp);
  local_3b0.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_230,"1","one",(int *)&local_3b0,local_39c + 2);
  if (local_230._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_228.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_230,"99","two",(int *)&local_3b0,local_39c + 1);
  if (local_230._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_230,"3","three",(int *)&local_3b0,local_39c);
  if (local_230._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  local_39c[0] = 0;
  local_39c[1] = 0;
  local_39c[2] = 0;
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--one=1","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"--two=2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_230,
             local_1f0);
  lVar4 = 0;
  do {
    if (local_200 + lVar4 != *(undefined1 **)((long)local_210 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_210 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  TApp::run(&this->super_TApp);
  local_3b0.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_230,"1","one",(int *)&local_3b0,local_39c + 2);
  if (local_230._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_230,"2","two",(int *)&local_3b0,local_39c + 1);
  if (local_230._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_230,"3","three",(int *)&local_3b0,local_39c);
  if (local_230._0_1_ == (ostream)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3b0.ptr_ + 8))();
      }
      local_3b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  remove(local_390._name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._name._M_dataplus._M_p != &local_390._name.field_2) {
    operator_delete(local_390._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, IniNotRequired) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    args = {"--one=1"};

    run();

    EXPECT_EQ(1, one);
    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    one = two = three = 0;
    args = {"--one=1", "--two=2"};

    run();

    EXPECT_EQ(1, one);
    EXPECT_EQ(2, two);
    EXPECT_EQ(3, three);
}